

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O0

Vec_Int_t *
Gia_PolynFindOrder(Gia_Man_t *pGia,Vec_Int_t *vFadds,Vec_Int_t *vHadds,int fVerbose,int fVeryVerbose
                  )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *p;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  int *pNodes;
  Gia_Man_t *pNew;
  Gia_Obj_t *pAnd_1;
  Gia_Obj_t *pAnd;
  Vec_Int_t *vMap;
  Vec_Int_t *vRecord2;
  Vec_Int_t *vLeft;
  Vec_Int_t *vRecord;
  int fFoundAll;
  int fFound;
  int Iter;
  int Entry;
  int iAnd;
  int iMaj;
  int iXor;
  int i;
  int fDumpLeftOver;
  int fVeryVerbose_local;
  int fVerbose_local;
  Vec_Int_t *vHadds_local;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *pGia_local;
  
  bVar1 = true;
  p = Vec_IntAlloc(100);
  iVar3 = Gia_ManObjNum(pGia);
  pVVar9 = Vec_IntStart(iVar3);
  for (iMaj = 0; iVar3 = Vec_IntSize(pGia->vCos), iMaj < iVar3; iMaj = iMaj + 1) {
    pGVar10 = Gia_ManCo(pGia,iMaj);
    iVar3 = Gia_ObjFaninId0p(pGia,pGVar10);
    Vec_IntWriteEntry(pVVar9,iVar3,1);
  }
  Vec_IntFreeP(&pGia->vXors);
  pVVar11 = Gia_PolynCollectLastXor(pGia,fVerbose);
  pGia->vXors = pVVar11;
  uVar4 = Vec_IntSize(pGia->vXors);
  printf("Collected %d topmost XORs\n",(ulong)uVar4);
  iMaj = 0;
  while( true ) {
    iVar3 = Vec_IntSize(pGia->vXors);
    if (iVar3 <= iMaj) {
      fFoundAll = 0;
      while (bVar1) {
        if (fVeryVerbose != 0) {
          printf("Iteration %d\n",(ulong)(uint)fFoundAll);
        }
        bVar1 = false;
        do {
          bVar2 = false;
          iVar3 = Vec_IntSize(vFadds);
          iMaj = iVar3 / 5;
          while (iMaj = iMaj + -1, -1 < iMaj) {
            uVar4 = Vec_IntEntry(vFadds,iMaj * 5 + 3);
            uVar5 = Vec_IntEntry(vFadds,iMaj * 5 + 4);
            iVar3 = Vec_IntEntry(pVVar9,uVar4);
            if ((iVar3 != 0) && (iVar3 = Vec_IntEntry(pVVar9,uVar5), iVar3 != 0)) {
              Vec_IntWriteEntry(pVVar9,uVar4,0);
              Vec_IntWriteEntry(pVVar9,uVar5,0);
              iVar3 = Vec_IntEntry(vFadds,iMaj * 5);
              Vec_IntWriteEntry(pVVar9,iVar3,1);
              iVar3 = Vec_IntEntry(vFadds,iMaj * 5 + 1);
              Vec_IntWriteEntry(pVVar9,iVar3,1);
              iVar3 = Vec_IntEntry(vFadds,iMaj * 5 + 2);
              Vec_IntWriteEntry(pVVar9,iVar3,1);
              iVar3 = Abc_Var2Lit2(iMaj,2);
              Vec_IntPush(p,iVar3);
              bVar2 = true;
              bVar1 = true;
              if (fVeryVerbose != 0) {
                uVar6 = Vec_IntEntry(vFadds,iMaj * 5);
                uVar7 = Vec_IntEntry(vFadds,iMaj * 5 + 1);
                uVar8 = Vec_IntEntry(vFadds,iMaj * 5 + 2);
                printf("Recognizing (%d %d) => FA(%d %d %d)\n",(ulong)uVar4,(ulong)uVar5,
                       (ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
              }
            }
          }
        } while (bVar2);
        iVar3 = Vec_IntSize(vHadds);
        iMaj = iVar3 / 2;
        while (iMaj = iMaj + -1, -1 < iMaj) {
          uVar4 = Vec_IntEntry(vHadds,iMaj * 2);
          uVar5 = Vec_IntEntry(vHadds,iMaj * 2 + 1);
          iVar3 = Vec_IntEntry(pVVar9,uVar4);
          if ((iVar3 != 0) && (iVar3 = Vec_IntEntry(pVVar9,uVar5), iVar3 != 0)) {
            pGVar10 = Gia_ManObj(pGia,uVar5);
            Vec_IntWriteEntry(pVVar9,uVar4,0);
            Vec_IntWriteEntry(pVVar9,uVar5,0);
            iVar3 = Gia_ObjFaninId0(pGVar10,uVar5);
            Vec_IntWriteEntry(pVVar9,iVar3,1);
            iVar3 = Gia_ObjFaninId1(pGVar10,uVar5);
            Vec_IntWriteEntry(pVVar9,iVar3,1);
            iVar3 = Abc_Var2Lit2(iMaj,1);
            Vec_IntPush(p,iVar3);
            bVar1 = true;
            if (fVeryVerbose != 0) {
              uVar6 = Gia_ObjFaninId0(pGVar10,uVar5);
              uVar7 = Gia_ObjFaninId1(pGVar10,uVar5);
              printf("Recognizing (%d %d) => HA(%d %d)\n",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,
                     (ulong)uVar7);
            }
          }
        }
        fFoundAll = fFoundAll + 1;
      }
      pVVar11 = Vec_IntAlloc(100);
      for (iMaj = 0; iVar3 = Vec_IntSize(pVVar9), iMaj < iVar3; iMaj = iMaj + 1) {
        iVar3 = Vec_IntEntry(pVVar9,iMaj);
        if (iVar3 != 0) {
          pGVar10 = Gia_ManObj(pGia,iMaj);
          iVar3 = Gia_ObjIsAnd(pGVar10);
          if (iVar3 != 0) {
            Vec_IntPush(pVVar11,iMaj);
          }
        }
      }
      Vec_IntFree(pVVar9);
      pVVar9 = Vec_IntAlloc(100);
      Gia_ManIncrementTravId(pGia);
      pNodes = Vec_IntArray(pVVar11);
      iVar3 = Vec_IntSize(pVVar11);
      Gia_ManCollectAnds(pGia,pNodes,iVar3,pVVar9,(Vec_Int_t *)0x0);
      for (iMaj = 0; iVar3 = Vec_IntSize(pVVar9), iMaj < iVar3; iMaj = iMaj + 1) {
        iVar3 = Vec_IntEntry(pVVar9,iMaj);
        iVar3 = Abc_Var2Lit2(iVar3,0);
        Vec_IntWriteEntry(pVVar9,iMaj,iVar3);
      }
      Vec_IntFree(pVVar11);
      Vec_IntReverseOrder(p);
      Vec_IntAppend(pVVar9,p);
      Vec_IntFree(p);
      return pVVar9;
    }
    uVar4 = Vec_IntEntry(pGia->vXors,iMaj);
    pGVar10 = Gia_ManObj(pGia,uVar4);
    iVar3 = Vec_IntEntry(pVVar9,uVar4);
    if (iVar3 == 0) break;
    Vec_IntWriteEntry(pVVar9,uVar4,0);
    iVar3 = Gia_ObjFaninId0(pGVar10,uVar4);
    Vec_IntWriteEntry(pVVar9,iVar3,1);
    iVar3 = Gia_ObjFaninId1(pGVar10,uVar4);
    Vec_IntWriteEntry(pVVar9,iVar3,1);
    iVar3 = Abc_Var2Lit2(uVar4,3);
    Vec_IntPush(p,iVar3);
    if (fVeryVerbose != 0) {
      uVar5 = Gia_ObjFaninId0(pGVar10,uVar4);
      uVar6 = Gia_ObjFaninId1(pGVar10,uVar4);
      printf("Recognizing %d => XXXOR(%d %d)\n",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    }
    iMaj = iMaj + 1;
  }
  __assert_fail("Vec_IntEntry(vMap, iAnd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecOrder.c"
                ,0x3e,
                "Vec_Int_t *Gia_PolynFindOrder(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_PolynFindOrder( Gia_Man_t * pGia, Vec_Int_t * vFadds, Vec_Int_t * vHadds, int fVerbose, int fVeryVerbose )
{
    int fDumpLeftOver = 0;
    int i, iXor, iMaj, iAnd, Entry, Iter, fFound, fFoundAll = 1;
    Vec_Int_t * vRecord = Vec_IntAlloc( 100 ), * vLeft, * vRecord2;
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCoDriverId( pGia, iAnd, i )
        Vec_IntWriteEntry( vMap, iAnd, 1 );

    // collect the last XOR
    Vec_IntFreeP( &pGia->vXors );
    pGia->vXors = Gia_PolynCollectLastXor( pGia, fVerbose );
    printf( "Collected %d topmost XORs\n", Vec_IntSize(pGia->vXors) );
    //Vec_IntPrint( p->vXors );
    Vec_IntForEachEntry( pGia->vXors, iAnd, i )
    {
        Gia_Obj_t * pAnd = Gia_ManObj( pGia, iAnd );
        assert( Vec_IntEntry(vMap, iAnd) );
        Vec_IntWriteEntry( vMap, iAnd, 0 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
        Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 3) );
        if ( fVeryVerbose )
            printf( "Recognizing %d => XXXOR(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
    }

    // detect FAs and HAs
    for ( Iter = 0; fFoundAll; Iter++ )
    {
        if ( fVeryVerbose )
            printf( "Iteration %d\n", Iter );

        // check if we can extract FADDs
        fFoundAll = 0;
        do {
            fFound = 0;
            for ( i = Vec_IntSize(vFadds)/5 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vFadds, 5*i+3);
                iMaj = Vec_IntEntry(vFadds, 5*i+4);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+0), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+1), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+2), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 2) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => FA(%d %d %d)\n", iXor, iMaj, Vec_IntEntry(vFadds, 5*i+0), Vec_IntEntry(vFadds, 5*i+1), Vec_IntEntry(vFadds, 5*i+2)  );
                }
            }
        } while ( fFound );
        // check if we can extract HADDs
        do {
            fFound = 0; 
            for ( i = Vec_IntSize(vHadds)/2 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vHadds, 2*i+0);
                iMaj = Vec_IntEntry(vHadds, 2*i+1);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Gia_Obj_t * pAnd = Gia_ManObj( pGia, iMaj );
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iMaj), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iMaj), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 1) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => HA(%d %d)\n", iXor, iMaj, Gia_ObjFaninId0(pAnd, iMaj), Gia_ObjFaninId1(pAnd, iMaj) );
                }
            }
            break; // only one iter!
        } while ( fFound );
        if ( fFoundAll )
            continue;
/*
        // find the last one
        Vec_IntForEachEntryReverse( vMap, Entry, iAnd )
            if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, iAnd)) )//&& Vec_IntFind(vFadds, iAnd) == -1 )//&& Vec_IntFind(vHadds, iAnd) == -1 )
            {
                Gia_Obj_t * pFan0, * pFan1, * pAnd = Gia_ManObj( pGia, iAnd );
                if ( !Gia_ObjRecognizeExor(pAnd, &pFan0, &pFan1) )
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                }
                else
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan0), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan1), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId0(pAnd, iAnd), 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId1(pAnd, iAnd), 0) );
                    printf( "Recognizing %d => XOR(%d %d)\n", iAnd, Gia_ObjId(pGia, pFan0), Gia_ObjId(pGia, pFan1) );
                }
                fFoundAll = 1;
                if ( fVeryVerbose )
                    printf( "Recognizing %d => AND(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
                break;
            }
*/
    }
    //Vec_IntPrint( vMap );

    // collect remaining ones
    vLeft = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vMap, Entry, i )
        if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, i)) )
            Vec_IntPush( vLeft, i );
    Vec_IntFree( vMap );

    // collect them in the topo order
    vRecord2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( pGia );
    Gia_ManCollectAnds( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), vRecord2, NULL );
    Vec_IntForEachEntry( vRecord2, iAnd, i )
        Vec_IntWriteEntry( vRecord2, i, Abc_Var2Lit2(iAnd, 0) );

    // dump remaining nodes as an AIG
    if ( fDumpLeftOver )
    {        
        Gia_Man_t * pNew;
        pNew = Gia_ManDupAndCones( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), 0 );
        Gia_AigerWrite( pNew, "leftover.aig", 0, 0, 0 );
        printf( "Leftover AIG with %d nodes is dumped into file \"%s\".\n", Gia_ManAndNum(pNew), "leftover.aig" );
        Gia_ManStop( pNew );
    }
    Vec_IntFree( vLeft );

    Vec_IntReverseOrder( vRecord );
    Vec_IntAppend( vRecord2, vRecord );
    Vec_IntFree( vRecord );
    return vRecord2;
}